

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CategoricalDistributionLayerParams::CategoricalDistributionLayerParams
          (CategoricalDistributionLayerParams *this,CategoricalDistributionLayerParams *from)

{
  void *pvVar1;
  int64 iVar2;
  int64 iVar3;
  float fVar4;
  float fVar5;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__CategoricalDistributionLayerParams_0042d818;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  iVar2 = from->seed_;
  iVar3 = from->numsamples_;
  fVar4 = from->eps_;
  fVar5 = from->temperature_;
  *(undefined8 *)((long)&this->numsamples_ + 4) = *(undefined8 *)((long)&from->numsamples_ + 4);
  this->eps_ = fVar4;
  this->temperature_ = fVar5;
  this->seed_ = iVar2;
  this->numsamples_ = iVar3;
  return;
}

Assistant:

CategoricalDistributionLayerParams::CategoricalDistributionLayerParams(const CategoricalDistributionLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&seed_, &from.seed_,
    reinterpret_cast<char*>(&temperature_) -
    reinterpret_cast<char*>(&seed_) + sizeof(temperature_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CategoricalDistributionLayerParams)
}